

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void vera::sdf(Image *_image)

{
  float fVar1;
  int iVar2;
  uint n;
  uint n_00;
  uint uVar3;
  float *f;
  ulong uVar4;
  undefined4 extraout_var;
  float *pfVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  ulong local_58;
  
  iVar2 = (*_image->_vptr_Image[8])();
  if (1 < iVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"We need a one channel image to compute an SDF",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    return;
  }
  n = (*_image->_vptr_Image[6])(_image);
  n_00 = (*_image->_vptr_Image[7])(_image);
  uVar3 = n_00;
  if ((int)n_00 < (int)n) {
    uVar3 = n;
  }
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    uVar4 = (long)(int)uVar3 * 4;
  }
  f = (float *)operator_new__(uVar4);
  uVar7 = (ulong)n;
  uVar4 = (ulong)n_00;
  __x = extraout_XMM0_Qa;
  if (0 < (int)n) {
    local_58 = 0;
    do {
      if (0 < (int)n_00) {
        uVar6 = local_58 & 0xffffffff;
        uVar9 = 0;
        do {
          iVar2 = (*_image->_vptr_Image[0xc])(_image,uVar6);
          f[uVar9] = *(float *)CONCAT44(extraout_var,iVar2);
          uVar9 = uVar9 + 1;
          uVar6 = (ulong)((int)uVar6 + n);
        } while (uVar4 != uVar9);
      }
      pfVar5 = dt(f,n_00);
      if (0 < (int)n_00) {
        uVar6 = local_58 & 0xffffffff;
        uVar9 = 0;
        do {
          fVar1 = pfVar5[uVar9];
          iVar2 = (*_image->_vptr_Image[0xc])(_image,uVar6);
          *(float *)CONCAT44(extraout_var_00,iVar2) = fVar1;
          uVar9 = uVar9 + 1;
          uVar6 = (ulong)((int)uVar6 + n);
        } while (uVar4 != uVar9);
      }
      operator_delete__(pfVar5);
      local_58 = local_58 + 1;
      __x = extraout_XMM0_Qa_00;
    } while (local_58 != uVar7);
  }
  if (0 < (int)n_00) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      if (0 < (int)n) {
        uVar9 = 0;
        do {
          iVar2 = (*_image->_vptr_Image[0xc])(_image,(ulong)(uint)((int)lVar8 + (int)uVar9));
          f[uVar9] = *(float *)CONCAT44(extraout_var_01,iVar2);
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      pfVar5 = dt(f,n);
      if (0 < (int)n) {
        uVar9 = 0;
        do {
          fVar1 = pfVar5[uVar9];
          iVar2 = (*_image->_vptr_Image[0xc])(_image,(ulong)(uint)((int)lVar8 + (int)uVar9));
          *(float *)CONCAT44(extraout_var_02,iVar2) = fVar1;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      operator_delete__(pfVar5);
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + uVar7;
      __x = extraout_XMM0_Qa_01;
    } while (uVar6 != uVar4);
  }
  sqrt(__x);
  autolevel(_image);
  operator_delete__(f);
  return;
}

Assistant:

void sdf(Image& _image) {
    if (_image.getChannels() > 1) {
        std::cout << "We need a one channel image to compute an SDF" << std::endl;
        return;
    }

    int width = _image.getWidth();
    int height = _image.getHeight();
    float *f = new float[std::max(width, height)];

    // transform along columns
    for (int x = 0; x < width; x++) {
        for (int y = 0; y < height; y++)
            f[y] = _image[y * width + x];
        
        float *d = dt(f, height);
        for (int y = 0; y < height; y++) 
            _image[y * width + x] = d[y];

        delete [] d;
    }

    // transform along rows
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++)
            f[x] = _image[y * width + x];
        
        float *d = dt(f, width);
        for (int x = 0; x < width; x++)
            _image[y * width + x] = d[x];
            
        delete [] d;
    }

    sqrt(_image);
    autolevel(_image);

    delete [] f;
}